

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classset.h
# Opt level: O0

int __thiscall
soplex::ClassSet<soplex::SVSetBase<double>::DLPSV>::remove
          (ClassSet<soplex::SVSetBase<double>::DLPSV> *this,char *__filename)

{
  bool bVar1;
  undefined7 extraout_var;
  Item *pIVar3;
  int iVar4;
  ClassSet<soplex::SVSetBase<double>::DLPSV> *unaff_retaddr;
  int idx;
  int iVar2;
  
  iVar4 = (int)__filename;
  bVar1 = has(unaff_retaddr,(int)((ulong)this >> 0x20));
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    iVar2 = this->thekey[iVar4].idx;
    this->theitem[iVar2].info = this->firstfree;
    this->firstfree = -1 - iVar2;
    while (-this->firstfree == this->thesize) {
      this->firstfree = this->theitem[-1 - this->firstfree].info;
      this->thesize = this->thesize + -1;
    }
    this->thenum = this->thenum + -1;
    pIVar3 = (Item *)((ulong)__filename & 0xffffffff);
    if (iVar4 != this->thenum) {
      this->thekey[iVar4] = this->thekey[this->thenum];
      pIVar3 = this->theitem + this->thekey[iVar4].idx;
      pIVar3->info = iVar4;
    }
    iVar2 = (int)pIVar3;
  }
  return iVar2;
}

Assistant:

void remove(int removenum)
   {
      if(has(removenum))
      {
         int idx = thekey[removenum].idx;

         theitem[idx].info = firstfree;
         firstfree = -idx - 1;

         while(-firstfree == thesize)
         {
            firstfree = theitem[ -firstfree - 1].info;
            --thesize;
         }

         --thenum;

         if(removenum != thenum)
         {
            thekey[removenum] = thekey[thenum];
            theitem[thekey[removenum].idx].info = removenum;
         }
      }
   }